

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O3

int __thiscall pg::DTLSolver::best_vertices(DTLSolver *this,bitset *V,bitset *R,int player)

{
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  uint64_t *puVar4;
  Game *pGVar5;
  uint64_t *puVar6;
  int *piVar7;
  byte bVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  unsigned_long *__tmp_1;
  size_t sVar12;
  ostream *poVar13;
  ulong uVar14;
  ulong uVar15;
  int *piVar16;
  uint *puVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  bitset Z;
  bitset CurZ;
  bitset CurR;
  int local_e4;
  bitset local_d0;
  ulong local_b0;
  int local_a4;
  bitset local_a0;
  _label_vertex local_80;
  bitset local_70;
  bitset local_50;
  
  puVar4 = V->_bits;
  sVar12 = 0;
  while (V->_bitssize != sVar12) {
    puVar6 = puVar4 + sVar12;
    sVar12 = sVar12 + 1;
    if (*puVar6 != 0) {
      __assert_fail("V.none()",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                    ,0x288,"int pg::DTLSolver::best_vertices(bitset &, bitset &, const int)");
    }
  }
  pGVar5 = (this->super_Solver).game;
  local_a0._size = pGVar5->n_vertices;
  uVar21 = local_a0._size + 0x3f;
  local_a0._bitssize = uVar21 >> 6;
  uVar15 = local_a0._bitssize << 3;
  local_a0._allocsize = uVar15;
  local_a0._bits = (uint64_t *)operator_new__(uVar15);
  if (0x3f < uVar21) {
    memset(local_a0._bits,0,uVar15);
  }
  local_d0._size = pGVar5->n_vertices;
  uVar21 = local_d0._size + 0x3f;
  local_d0._bitssize = uVar21 >> 6;
  uVar15 = local_d0._bitssize << 3;
  local_d0._allocsize = uVar15;
  local_d0._bits = (uint64_t *)operator_new__(uVar15);
  if (0x3f < uVar21) {
    memset(local_d0._bits,0,uVar15);
  }
  local_50._size = pGVar5->n_vertices;
  uVar21 = local_50._size + 0x3f;
  local_50._bitssize = uVar21 >> 6;
  uVar15 = local_50._bitssize << 3;
  local_50._allocsize = uVar15;
  local_50._bits = (uint64_t *)operator_new__(uVar15);
  if (0x3f < uVar21) {
    memset(local_50._bits,0,uVar15);
  }
  local_70._size = pGVar5->n_vertices;
  uVar21 = local_70._size + 0x3f;
  local_70._bitssize = uVar21 >> 6;
  uVar15 = local_70._bitssize << 3;
  local_70._allocsize = uVar15;
  local_70._bits = (uint64_t *)operator_new__(uVar15);
  if (0x3f < uVar21) {
    memset(local_70._bits,0,uVar15);
  }
  lVar18 = pGVar5->n_vertices;
  if (lVar18 < 1) {
LAB_0017dd09:
    local_e4 = 0;
  }
  else {
    puVar6 = R->_bits;
    uVar15 = 0;
    bVar22 = false;
    do {
      while ((uVar21 = uVar15 >> 6, (puVar6[uVar21] >> (uVar15 & 0x3f) & 1) == 0 ||
             ((pGVar5->_priority[uVar15] & 1U) != player))) {
        uVar15 = uVar15 + 1;
        if (lVar18 <= (long)uVar15) {
          if (!bVar22) goto LAB_0017dd09;
          goto LAB_0017d5ac;
        }
      }
      uVar14 = uVar15 & 0x3f;
      uVar15 = uVar15 + 1;
      bVar22 = true;
      puVar1 = puVar4 + uVar21;
      *puVar1 = *puVar1 | 1L << uVar14;
      lVar18 = pGVar5->n_vertices;
    } while ((long)uVar15 < lVar18);
LAB_0017d5ac:
    local_b0 = 0;
    while( true ) {
      bitset::operator=(&local_a0,V);
      if (2 < (this->super_Solver).trace) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_Solver).logger,"\x1b[1;38;5;202mcurrent best vertices:\x1b[m",0x26);
        for (sVar12 = bitset::find_first(V); sVar12 != 0xffffffffffffffff;
            sVar12 = bitset::find_next(V,sVar12)) {
          poVar13 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," \x1b[1;38;5;15m",0xd);
          local_80.g = (this->super_Solver).game;
          local_80.v = (int)sVar12;
          poVar13 = operator<<(poVar13,&local_80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m",3);
        }
        poVar13 = (this->super_Solver).logger;
        cVar9 = (char)poVar13;
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar9);
        std::ostream::put(cVar9);
        std::ostream::flush();
      }
      bitset::operator=(&local_50,R);
      local_e4 = 1;
      uVar10 = (int)((this->super_Solver).game)->n_vertices - 1;
      if ((int)uVar10 < 0) break;
      local_b0 = (ulong)((int)local_b0 + 1);
      uVar15 = (ulong)uVar10;
      do {
        uVar21 = uVar15 >> 6;
        if (((V->_bits[uVar21] >> (uVar15 & 0x3f) & 1) != 0) &&
           (uVar14 = 1L << (uVar15 & 0x3f), (local_d0._bits[uVar21] & uVar14) == 0)) {
          local_70._bits[uVar21] = local_70._bits[uVar21] | uVar14;
          this->str[uVar15] = -1;
          iVar11 = (this->Q).pointer;
          (this->Q).pointer = iVar11 + 1;
          (this->Q).queue[iVar11] = (uint)uVar15;
          iVar11 = (this->Q).pointer;
          if (iVar11 != 0) {
            iVar2 = ((this->super_Solver).game)->_priority[uVar15];
            do {
              (this->Q).pointer = iVar11 + -1;
              uVar3 = (this->Q).queue[(long)iVar11 + -1];
              uVar21 = (ulong)(int)uVar3;
              bVar8 = (byte)uVar3 & 0x3f;
              local_50._bits[uVar21 >> 6] =
                   local_50._bits[uVar21 >> 6] &
                   (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              attractVertices(this,player,uVar3,&local_50,&local_70,&local_50,iVar2);
              piVar7 = this->tin[uVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (piVar16 = this->tin[uVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start; piVar16 != piVar7;
                  piVar16 = piVar16 + 1) {
                attractTangle(this,*piVar16,player,&local_50,&local_70,&local_50,iVar2);
              }
              iVar11 = (this->Q).pointer;
            } while (iVar11 != 0);
          }
          if (local_d0._bitssize != 0) {
            uVar21 = 0;
            do {
              local_d0._bits[uVar21] = local_d0._bits[uVar21] | local_70._bits[uVar21];
              uVar21 = uVar21 + 1;
            } while (local_d0._bitssize != uVar21);
          }
          if (local_70._bitssize != 0) {
            memset(local_70._bits,0,local_70._bitssize << 3);
          }
        }
        bVar22 = 0 < (long)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar22);
      pGVar5 = (this->super_Solver).game;
      lVar18 = pGVar5->n_vertices;
      uVar10 = (int)lVar18 - 1;
      if ((int)uVar10 < 0) break;
      piVar16 = this->Candidates;
      uVar19 = 0;
      puVar4 = V->_bits;
      uVar15 = (ulong)uVar10;
      do {
        if ((puVar4[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0) {
          piVar7 = pGVar5->_outedges;
          lVar20 = (long)pGVar5->_firstouts[uVar15];
          uVar10 = piVar7[lVar20];
          uVar21 = (ulong)uVar10;
          if ((uint)(((pGVar5->_owner)._bits[uVar15 >> 6] & 1L << (uVar15 & 0x3f)) != 0) == player)
          {
            if (uVar10 != 0xffffffff) {
              puVar17 = (uint *)(piVar7 + lVar20 + 1);
              do {
                if ((local_d0._bits[(ulong)(long)(int)uVar21 >> 6] >> ((long)(int)uVar21 & 0x3fU) &
                    1) != 0) goto LAB_0017d97b;
                uVar10 = *puVar17;
                uVar21 = (ulong)uVar10;
                puVar17 = puVar17 + 1;
              } while (uVar10 != 0xffffffff);
            }
          }
          else if (uVar10 != 0xffffffff) {
            puVar17 = (uint *)(piVar7 + lVar20);
            bVar22 = false;
            do {
              while( true ) {
                puVar17 = puVar17 + 1;
                uVar14 = (ulong)(long)(int)uVar21 >> 6;
                if ((local_d0._bits[uVar14] >> (uVar21 & 0x3f) & 1) != 0) break;
                if ((R->_bits[uVar14] & 1L << (uVar21 & 0x3f)) != 0) goto LAB_0017d967;
                uVar21 = (ulong)*puVar17;
                if (*puVar17 == 0xffffffff) {
                  if (!bVar22) goto LAB_0017d967;
                  goto LAB_0017d97b;
                }
              }
              uVar21 = (ulong)*puVar17;
              bVar22 = true;
            } while (*puVar17 != 0xffffffff);
            goto LAB_0017d97b;
          }
LAB_0017d967:
          lVar20 = (long)(int)uVar19;
          uVar19 = uVar19 + 1;
          piVar16[lVar20] = (int)uVar15;
        }
LAB_0017d97b:
        bVar22 = 0 < (long)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar22);
      if (uVar19 == 0) break;
      local_a4 = *(int *)((long)pGVar5->_priority + ((lVar18 << 0x20) + -0x100000000 >> 0x1e));
      if (-1 < local_a4) {
        iVar11 = 0;
        do {
          for (sVar12 = bitset::find_first(&local_d0); sVar12 != 0xffffffffffffffff;
              sVar12 = bitset::find_next(&local_d0,sVar12)) {
            iVar2 = (this->Q).pointer;
            (this->Q).pointer = iVar2 + 1;
            (this->Q).queue[iVar2] = (uint)sVar12;
          }
          iVar2 = (this->Q).pointer;
          while (iVar2 != 0) {
            (this->Q).pointer = iVar2 + -1;
            uVar3 = (this->Q).queue[(long)iVar2 + -1];
            attractVertices(this,player,uVar3,R,&local_d0,R,iVar11);
            piVar7 = this->tin[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (piVar16 = this->tin[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start; piVar16 != piVar7;
                piVar16 = piVar16 + 1) {
              attractTangle(this,*piVar16,player,R,&local_d0,R,iVar11);
            }
            iVar2 = (this->Q).pointer;
          }
          if (0 < (int)uVar19) {
            pGVar5 = (this->super_Solver).game;
            piVar16 = this->Candidates;
            uVar15 = 0;
            do {
              uVar21 = (ulong)piVar16[uVar15];
              if (uVar21 != 0xffffffffffffffff) {
                if (pGVar5->_priority[uVar21] <= iVar11) break;
                piVar7 = pGVar5->_outedges;
                lVar18 = (long)pGVar5->_firstouts[uVar21];
                uVar10 = piVar7[lVar18];
                uVar14 = (ulong)uVar10;
                if ((uint)(((pGVar5->_owner)._bits[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0) ==
                    player) {
                  if (uVar10 != 0xffffffff) {
                    puVar17 = (uint *)(piVar7 + lVar18 + 1);
                    do {
                      if ((local_d0._bits[(ulong)(long)(int)uVar14 >> 6] >>
                           ((long)(int)uVar14 & 0x3fU) & 1) != 0) goto LAB_0017db71;
                      uVar10 = *puVar17;
                      uVar14 = (ulong)uVar10;
                      puVar17 = puVar17 + 1;
                    } while (uVar10 != 0xffffffff);
                  }
                }
                else if (uVar10 != 0xffffffff) {
                  puVar17 = (uint *)(piVar7 + lVar18);
                  bVar22 = false;
                  do {
                    while( true ) {
                      puVar17 = puVar17 + 1;
                      uVar21 = (ulong)(long)(int)uVar14 >> 6;
                      if ((local_d0._bits[uVar21] >> (uVar14 & 0x3f) & 1) != 0) break;
                      if ((R->_bits[uVar21] & 1L << (uVar14 & 0x3f)) != 0) goto LAB_0017db78;
                      uVar14 = (ulong)*puVar17;
                      if (*puVar17 == 0xffffffff) {
                        if (!bVar22) goto LAB_0017db78;
                        goto LAB_0017db71;
                      }
                    }
                    uVar14 = (ulong)*puVar17;
                    bVar22 = true;
                  } while (*puVar17 != 0xffffffff);
LAB_0017db71:
                  piVar16[uVar15] = -1;
                }
              }
LAB_0017db78:
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar19);
          }
          bVar22 = iVar11 != local_a4;
          iVar11 = iVar11 + 1;
        } while (bVar22);
      }
      if ((int)uVar19 < 1) {
        bVar22 = false;
      }
      else {
        uVar15 = 0;
        bVar22 = false;
        do {
          iVar11 = this->Candidates[uVar15];
          if ((long)iVar11 != 0xffffffffffffffff) {
            bVar8 = (byte)iVar11 & 0x3f;
            V->_bits[(ulong)(long)iVar11 >> 6] =
                 V->_bits[(ulong)(long)iVar11 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
            if (1 < (this->super_Solver).trace) {
              if (!bVar22) {
                poVar13 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,"\x1b[1;38;5;202mdistance ",0x16);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)local_b0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m:",4);
              }
              poVar13 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," \x1b[1;36m",8);
              local_80.g = (this->super_Solver).game;
              local_80.v = iVar11;
              poVar13 = operator<<(poVar13,&local_80);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m",3);
            }
            bVar22 = true;
          }
          uVar15 = uVar15 + 1;
        } while (uVar19 != uVar15);
        if ((bVar22) && (0 < (this->super_Solver).trace)) {
          poVar13 = (this->super_Solver).logger;
          cVar9 = (char)poVar13;
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar9);
          std::ostream::put(cVar9);
          std::ostream::flush();
        }
      }
      if (local_d0._bitssize != 0) {
        memset(local_d0._bits,0,local_d0._bitssize << 3);
      }
      if (!bVar22) break;
      uVar15 = 0;
      puVar4 = V->_bits;
      uVar21 = V->_bitssize;
      do {
        if (uVar21 == uVar15) {
          local_e4 = -1;
          sVar12 = V->_size;
          V->_size = local_a0._size;
          V->_bitssize = local_a0._bitssize;
          uVar15 = V->_allocsize;
          V->_allocsize = local_a0._allocsize;
          V->_bits = local_a0._bits;
          local_a0._bits = puVar4;
          local_a0._size = sVar12;
          local_a0._bitssize = uVar21;
          local_a0._allocsize = uVar15;
          goto LAB_0017dd58;
        }
        puVar6 = puVar4 + uVar15;
        uVar15 = uVar15 + 1;
      } while (*puVar6 == 0);
    }
  }
LAB_0017dd58:
  if (local_70._bits != (uint64_t *)0x0) {
    operator_delete__(local_70._bits);
  }
  if (local_50._bits != (uint64_t *)0x0) {
    operator_delete__(local_50._bits);
  }
  if (local_d0._bits != (uint64_t *)0x0) {
    operator_delete__(local_d0._bits);
  }
  if (local_a0._bits != (uint64_t *)0x0) {
    operator_delete__(local_a0._bits);
  }
  return local_e4;
}

Assistant:

int
DTLSolver::best_vertices(bitset &V, bitset &R, const int player)
{
#ifndef NDEBUG
    // Assume: V is empty
    assert(V.none());
#endif

    bitset prevV(nodecount()); // the previous V
    bitset Z(nodecount()); // the current Z
    bitset CurR(nodecount());
    bitset CurZ(nodecount());
    int curdist = 0;

    /**
     * Initialize V := vertices in <R> with priority of <player>
     */

    bool hasV = false;
    for (int v=0; v<nodecount(); v++) {
        if (R[v] and (priority(v)&1) == player) {
            hasV = true;
            V[v] = true;
        }
    }
    if (!hasV) return 0;

    /**
     * Now we prune until no more vertices are removed from V, or V is empty.
     */

    while (true) {
        curdist++;
        prevV = V;

#ifndef NDEBUG
        if (trace >= 3) {
            logger << "\033[1;38;5;202mcurrent best vertices:\033[m";
            for (auto v = V.find_first(); v != bitset::npos; v = V.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        // First compute the current <player> region Z

        CurR = R;
        for (int top=nodecount()-1; top>=0; top--) {
            if (V[top] and !Z[top]) {
                CurZ[top] = true; // add to <Z>
                str[top] = -1; // don't care, but needed for correct trace reporting
                Q.push(top);
                const int pr = priority(top);
                while (Q.nonempty()) {
                    const int v = Q.pop();
                    CurR[v] = false;
                    attractVertices(player, v, CurR, CurZ, CurR, pr);
                    attractTangles(player, v, CurR, CurZ, CurR, pr);
                }
                Z |= CurZ;
                CurZ.reset();
            }
        }

        /**
         * Now find all Candidates: v \in V that do not yet have a good path to Z
         */

        int n_candidates = 0;
        for (int v=nodecount()-1; v>=0; v--) {
            if (V[v] and !attracts(player, v, Z, R)) Candidates[n_candidates++] = v;
        }
        if (n_candidates == 0) return 1; // no more vertices are removed

        // Now attract from R to Z, "slowly"
        // Note: we have to be carefully increasing t. Why?
        // because we might attract tangles OR vertices at some threshold...
        const int max_prio = priority(nodecount()-1);
        for (int t=0; t<=max_prio; t++) {
            // add vertices in Z to Q
            for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) Q.push(v);

            // run tangle attractor to Z with the given threshold
            while (Q.nonempty()) {
                const int u = Q.pop();
                attractVertices(player, u, R, Z, R, t);
                attractTangles(player, u, R, Z, R, t);
            }

            // Now check if any candidate is now attracted (via the good path)
            for (int x=0; x<n_candidates; x++) {
                const int u = Candidates[x];
                if (u != -1) {
                    if (priority(u) <= t) break; // stop checking once we are below the threshold
                    if (attracts(player, u, Z, R)) Candidates[x] = -1;
                }
            }
        }

        /**
         * We have now attracted all possible vertices to <Z>.
         * Any remaining vertices in Candidates are now distractions...
         */

        bool changed_V = false;
        for (int x=0; x<n_candidates; x++) {
            const int u = Candidates[x];
            if (u == -1) continue;
            V[u] = false;
            if (trace >= 2) {
                if (!changed_V) {
                    logger << "\033[1;38;5;202mdistance " << curdist << "\033[m:";
                }
                logger << " \033[1;36m" << label_vertex(u) << "\033[m";
            }
            changed_V = true;
        }
        if (changed_V and trace >= 1) logger << std::endl;

        Z.reset();

        if (!changed_V) {
            // No vertices were removed from V
            return 1;
        } else if (!V.any()) {
            // All vertices were removed from V
            V.swap(prevV);
            return -1;
        }
    }

    return true;
}